

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

bool CoreML::Specification::operator==
               (RepeatedField<unsigned_long> *a,RepeatedField<unsigned_long> *b)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  int index;
  bool bVar3;
  
  if (a->current_size_ != b->current_size_) {
    return false;
  }
  if (0 < a->current_size_) {
    index = 0;
    do {
      puVar2 = google::protobuf::RepeatedField<unsigned_long>::Get(a,index);
      uVar1 = *puVar2;
      puVar2 = google::protobuf::RepeatedField<unsigned_long>::Get(b,index);
      bVar3 = uVar1 == *puVar2;
      if (!bVar3) {
        return bVar3;
      }
      index = index + 1;
    } while (index < a->current_size_);
    return bVar3;
  }
  return true;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}